

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

_Bool ssh2_connection_need_antispoof_prompt(ssh2_connection_state *s)

{
  _Bool _Var1;
  ssh2_connection_state *s_local;
  
  seat_set_trust_status((s->ppl).seat,false);
  _Var1 = seat_has_mixed_input_stream((s->ppl).seat);
  if (_Var1) {
    _Var1 = seat_can_set_trust_status((s->ppl).seat);
    if (_Var1) {
      s_local._7_1_ = false;
    }
    else {
      _Var1 = ssh_is_bare((s->ppl).ssh);
      if (_Var1) {
        s_local._7_1_ = false;
      }
      else {
        s_local._7_1_ = true;
      }
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

bool ssh2_connection_need_antispoof_prompt(struct ssh2_connection_state *s)
{
    seat_set_trust_status(s->ppl.seat, false);
    if (!seat_has_mixed_input_stream(s->ppl.seat))
        return false;
    if (seat_can_set_trust_status(s->ppl.seat))
        return false;
    if (ssh_is_bare(s->ppl.ssh))
        return false;
    return true;
}